

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  StrAccum *pAccum;
  int n;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_type(*argv);
  if ((iVar1 != 5) && (pvVar3 = sqlite3_aggregate_context(context,0x20), pvVar3 != (void *)0x0)) {
    iVar1 = sqlite3_value_bytes(*argv);
    if (argc == 2) {
      iVar2 = sqlite3_value_bytes(argv[1]);
      pAccum._4_4_ = iVar2 + iVar1;
    }
    else {
      pAccum._4_4_ = iVar1 + 1;
    }
    if (pAccum._4_4_ < *(int *)((long)pvVar3 + 0x18)) {
      *(int *)((long)pvVar3 + 0x18) = *(int *)((long)pvVar3 + 0x18) - pAccum._4_4_;
      memmove(*(void **)((long)pvVar3 + 8),
              (void *)(*(long *)((long)pvVar3 + 8) + (long)pAccum._4_4_),
              (ulong)*(uint *)((long)pvVar3 + 0x18));
    }
    else {
      *(undefined4 *)((long)pvVar3 + 0x18) = 0;
    }
    if (*(int *)((long)pvVar3 + 0x18) == 0) {
      *(undefined4 *)((long)pvVar3 + 0x14) = 0;
    }
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  StrAccum *pAccum;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));
  /* pAccum is always non-NULL since groupConcatStep() will have always
  ** run frist to initialize it */
  if( ALWAYS(pAccum) ){
    n = sqlite3_value_bytes(argv[0]);
    if( argc==2 ){
      n += sqlite3_value_bytes(argv[1]);
    }else{
      n++;
    }
    if( n>=(int)pAccum->nChar ){
      pAccum->nChar = 0;
    }else{
      pAccum->nChar -= n;
      memmove(pAccum->zText, &pAccum->zText[n], pAccum->nChar);
    }
    if( pAccum->nChar==0 ) pAccum->mxAlloc = 0;
  }
}